

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O0

DescVector * llvm::getDescriptions(void)

{
  reference pvVar1;
  vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  *in_RDI;
  Description local_fb;
  Description local_f8;
  Description local_f5;
  Description local_f2;
  Description local_ef;
  Description local_ec;
  Description local_e9;
  Description local_e6;
  Description local_e3;
  Description local_e0;
  Description local_dd;
  Description local_da;
  Description local_d7;
  Description local_d4;
  Description local_d1;
  Description local_ce;
  Description local_cb;
  Description local_c8;
  Description local_c5;
  Description local_c2;
  Description local_bf;
  Description local_bc;
  Description local_b9;
  Description local_b6;
  Description local_b3;
  ushort local_b0;
  Description local_ad;
  ushort local_aa;
  uint16_t LA_2;
  undefined1 uStack_a6;
  Encoding local_a5;
  ushort local_a4;
  uint16_t LA_1;
  Encoding local_a0;
  Description local_9f;
  uint16_t LA;
  Encoding local_9a;
  Description local_99;
  Description local_96;
  Description local_93;
  Description local_90;
  Description local_8d;
  Description local_8a;
  Description local_87;
  Description local_84;
  Description local_81;
  Description local_7e;
  Description local_7b;
  Description local_78;
  Description local_75;
  Description local_72;
  Description local_6f;
  Description local_6c;
  Description local_69;
  Description local_66;
  Description local_63;
  Description local_60;
  Description local_5d;
  Description local_5a;
  Description local_57;
  Description local_54;
  Description local_51;
  Description local_4e;
  Description local_4b;
  Description local_48;
  Description local_45;
  Description local_42;
  Description local_3f;
  Description local_3c;
  Description local_39;
  Description local_36;
  Description local_33;
  Description local_30;
  Description local_2d;
  Description local_2a;
  Description local_27 [7];
  undefined1 local_11;
  DescVector *Descriptions;
  
  local_11 = 0;
  std::
  vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ::vector(in_RDI);
  std::
  vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
  ::resize(in_RDI,0xff);
  DWARFExpression::Operation::Description::Description(local_27,Dwarf2,SizeAddr,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,3);
  pvVar1->Op[1] = local_27[0].Op[1];
  pvVar1->Version = local_27[0].Version;
  pvVar1->Op[0] = local_27[0].Op[0];
  DWARFExpression::Operation::Description::Description(&local_2a,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,6);
  pvVar1->Op[1] = local_2a.Op[1];
  pvVar1->Version = local_2a.Version;
  pvVar1->Op[0] = local_2a.Op[0];
  DWARFExpression::Operation::Description::Description(&local_2d,Dwarf2,Size1,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,8);
  pvVar1->Op[1] = local_2d.Op[1];
  pvVar1->Version = local_2d.Version;
  pvVar1->Op[0] = local_2d.Op[0];
  DWARFExpression::Operation::Description::Description(&local_30,Dwarf2,SignBit,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,9);
  pvVar1->Op[1] = local_30.Op[1];
  pvVar1->Version = local_30.Version;
  pvVar1->Op[0] = local_30.Op[0];
  DWARFExpression::Operation::Description::Description(&local_33,Dwarf2,Size2,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,10);
  pvVar1->Op[1] = local_33.Op[1];
  pvVar1->Version = local_33.Version;
  pvVar1->Op[0] = local_33.Op[0];
  DWARFExpression::Operation::Description::Description(&local_36,Dwarf2,SignedSize2,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xb);
  pvVar1->Op[1] = local_36.Op[1];
  pvVar1->Version = local_36.Version;
  pvVar1->Op[0] = local_36.Op[0];
  DWARFExpression::Operation::Description::Description(&local_39,Dwarf2,Size4,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xc);
  pvVar1->Op[1] = local_39.Op[1];
  pvVar1->Version = local_39.Version;
  pvVar1->Op[0] = local_39.Op[0];
  DWARFExpression::Operation::Description::Description(&local_3c,Dwarf2,SignedSize4,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xd);
  pvVar1->Op[1] = local_3c.Op[1];
  pvVar1->Version = local_3c.Version;
  pvVar1->Op[0] = local_3c.Op[0];
  DWARFExpression::Operation::Description::Description(&local_3f,Dwarf2,Size8,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xe);
  pvVar1->Op[1] = local_3f.Op[1];
  pvVar1->Version = local_3f.Version;
  pvVar1->Op[0] = local_3f.Op[0];
  DWARFExpression::Operation::Description::Description(&local_42,Dwarf2,SignedSize8,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xf);
  pvVar1->Op[1] = local_42.Op[1];
  pvVar1->Version = local_42.Version;
  pvVar1->Op[0] = local_42.Op[0];
  DWARFExpression::Operation::Description::Description(&local_45,Dwarf2,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x10);
  pvVar1->Op[1] = local_45.Op[1];
  pvVar1->Version = local_45.Version;
  pvVar1->Op[0] = local_45.Op[0];
  DWARFExpression::Operation::Description::Description(&local_48,Dwarf2,SignedSizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x11);
  pvVar1->Op[1] = local_48.Op[1];
  pvVar1->Version = local_48.Version;
  pvVar1->Op[0] = local_48.Op[0];
  DWARFExpression::Operation::Description::Description(&local_4b,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x12);
  pvVar1->Op[1] = local_4b.Op[1];
  pvVar1->Version = local_4b.Version;
  pvVar1->Op[0] = local_4b.Op[0];
  DWARFExpression::Operation::Description::Description(&local_4e,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x13);
  pvVar1->Op[1] = local_4e.Op[1];
  pvVar1->Version = local_4e.Version;
  pvVar1->Op[0] = local_4e.Op[0];
  DWARFExpression::Operation::Description::Description(&local_51,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x14);
  pvVar1->Op[1] = local_51.Op[1];
  pvVar1->Version = local_51.Version;
  pvVar1->Op[0] = local_51.Op[0];
  DWARFExpression::Operation::Description::Description(&local_54,Dwarf2,Size1,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x15);
  pvVar1->Op[1] = local_54.Op[1];
  pvVar1->Version = local_54.Version;
  pvVar1->Op[0] = local_54.Op[0];
  DWARFExpression::Operation::Description::Description(&local_57,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x16);
  pvVar1->Op[1] = local_57.Op[1];
  pvVar1->Version = local_57.Version;
  pvVar1->Op[0] = local_57.Op[0];
  DWARFExpression::Operation::Description::Description(&local_5a,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x17);
  pvVar1->Op[1] = local_5a.Op[1];
  pvVar1->Version = local_5a.Version;
  pvVar1->Op[0] = local_5a.Op[0];
  DWARFExpression::Operation::Description::Description(&local_5d,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x18);
  pvVar1->Op[1] = local_5d.Op[1];
  pvVar1->Version = local_5d.Version;
  pvVar1->Op[0] = local_5d.Op[0];
  DWARFExpression::Operation::Description::Description(&local_60,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x19);
  pvVar1->Op[1] = local_60.Op[1];
  pvVar1->Version = local_60.Version;
  pvVar1->Op[0] = local_60.Op[0];
  DWARFExpression::Operation::Description::Description(&local_63,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1a);
  pvVar1->Op[1] = local_63.Op[1];
  pvVar1->Version = local_63.Version;
  pvVar1->Op[0] = local_63.Op[0];
  DWARFExpression::Operation::Description::Description(&local_66,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1b);
  pvVar1->Op[1] = local_66.Op[1];
  pvVar1->Version = local_66.Version;
  pvVar1->Op[0] = local_66.Op[0];
  DWARFExpression::Operation::Description::Description(&local_69,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1c);
  pvVar1->Op[1] = local_69.Op[1];
  pvVar1->Version = local_69.Version;
  pvVar1->Op[0] = local_69.Op[0];
  DWARFExpression::Operation::Description::Description(&local_6c,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1d);
  pvVar1->Op[1] = local_6c.Op[1];
  pvVar1->Version = local_6c.Version;
  pvVar1->Op[0] = local_6c.Op[0];
  DWARFExpression::Operation::Description::Description(&local_6f,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1e);
  pvVar1->Op[1] = local_6f.Op[1];
  pvVar1->Version = local_6f.Version;
  pvVar1->Op[0] = local_6f.Op[0];
  DWARFExpression::Operation::Description::Description(&local_72,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x1f);
  pvVar1->Op[1] = local_72.Op[1];
  pvVar1->Version = local_72.Version;
  pvVar1->Op[0] = local_72.Op[0];
  DWARFExpression::Operation::Description::Description(&local_75,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x20);
  pvVar1->Op[1] = local_75.Op[1];
  pvVar1->Version = local_75.Version;
  pvVar1->Op[0] = local_75.Op[0];
  DWARFExpression::Operation::Description::Description(&local_78,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x21);
  pvVar1->Op[1] = local_78.Op[1];
  pvVar1->Version = local_78.Version;
  pvVar1->Op[0] = local_78.Op[0];
  DWARFExpression::Operation::Description::Description(&local_7b,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x22);
  pvVar1->Op[1] = local_7b.Op[1];
  pvVar1->Version = local_7b.Version;
  pvVar1->Op[0] = local_7b.Op[0];
  DWARFExpression::Operation::Description::Description(&local_7e,Dwarf2,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x23);
  pvVar1->Op[1] = local_7e.Op[1];
  pvVar1->Version = local_7e.Version;
  pvVar1->Op[0] = local_7e.Op[0];
  DWARFExpression::Operation::Description::Description(&local_81,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x24);
  pvVar1->Op[1] = local_81.Op[1];
  pvVar1->Version = local_81.Version;
  pvVar1->Op[0] = local_81.Op[0];
  DWARFExpression::Operation::Description::Description(&local_84,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x25);
  pvVar1->Op[1] = local_84.Op[1];
  pvVar1->Version = local_84.Version;
  pvVar1->Op[0] = local_84.Op[0];
  DWARFExpression::Operation::Description::Description(&local_87,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x26);
  pvVar1->Op[1] = local_87.Op[1];
  pvVar1->Version = local_87.Version;
  pvVar1->Op[0] = local_87.Op[0];
  DWARFExpression::Operation::Description::Description(&local_8a,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x27);
  pvVar1->Op[1] = local_8a.Op[1];
  pvVar1->Version = local_8a.Version;
  pvVar1->Op[0] = local_8a.Op[0];
  DWARFExpression::Operation::Description::Description(&local_8d,Dwarf2,SignedSize2,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2f);
  pvVar1->Op[1] = local_8d.Op[1];
  pvVar1->Version = local_8d.Version;
  pvVar1->Op[0] = local_8d.Op[0];
  DWARFExpression::Operation::Description::Description(&local_90,Dwarf2,SignedSize2,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x28);
  pvVar1->Op[1] = local_90.Op[1];
  pvVar1->Version = local_90.Version;
  pvVar1->Op[0] = local_90.Op[0];
  DWARFExpression::Operation::Description::Description(&local_93,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x29);
  pvVar1->Op[1] = local_93.Op[1];
  pvVar1->Version = local_93.Version;
  pvVar1->Op[0] = local_93.Op[0];
  DWARFExpression::Operation::Description::Description(&local_96,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2a);
  pvVar1->Op[1] = local_96.Op[1];
  pvVar1->Version = local_96.Version;
  pvVar1->Op[0] = local_96.Op[0];
  DWARFExpression::Operation::Description::Description(&local_99,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2b);
  pvVar1->Op[1] = local_99.Op[1];
  pvVar1->Version = local_99.Version;
  pvVar1->Op[0] = local_99.Op[0];
  DWARFExpression::Operation::Description::Description((Description *)&LA,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2c);
  pvVar1->Op[1] = local_9a;
  pvVar1->Version = (undefined1)LA;
  pvVar1->Op[0] = LA._1_1_;
  DWARFExpression::Operation::Description::Description(&local_9f,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2d);
  pvVar1->Op[1] = local_9f.Op[1];
  pvVar1->Version = local_9f.Version;
  pvVar1->Op[0] = local_9f.Op[0];
  DWARFExpression::Operation::Description::Description((Description *)&LA_1,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x2e);
  pvVar1->Version = (undefined1)LA_1;
  pvVar1->Op[0] = LA_1._1_1_;
  pvVar1->Op[1] = local_a0;
  for (local_a4 = 0x30; local_a4 < 0x50; local_a4 = local_a4 + 1) {
    DWARFExpression::Operation::Description::Description
              ((Description *)((long)&LA_2 + 1),Dwarf2,SizeNA,SizeNA);
    pvVar1 = std::
             vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ::operator[](in_RDI,(ulong)local_a4);
    pvVar1->Version = LA_2._1_1_;
    pvVar1->Op[0] = uStack_a6;
    pvVar1->Op[1] = local_a5;
  }
  for (local_aa = 0x50; local_aa < 0x70; local_aa = local_aa + 1) {
    DWARFExpression::Operation::Description::Description(&local_ad,Dwarf2,SizeNA,SizeNA);
    pvVar1 = std::
             vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ::operator[](in_RDI,(ulong)local_aa);
    pvVar1->Version = local_ad.Version;
    pvVar1->Op[0] = local_ad.Op[0];
    pvVar1->Op[1] = local_ad.Op[1];
  }
  for (local_b0 = 0x70; local_b0 < 0x90; local_b0 = local_b0 + 1) {
    DWARFExpression::Operation::Description::Description(&local_b3,Dwarf2,SignedSizeLEB,SizeNA);
    pvVar1 = std::
             vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
             ::operator[](in_RDI,(ulong)local_b0);
    pvVar1->Version = local_b3.Version;
    pvVar1->Op[0] = local_b3.Op[0];
    pvVar1->Op[1] = local_b3.Op[1];
  }
  DWARFExpression::Operation::Description::Description(&local_b6,Dwarf2,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x90);
  pvVar1->Op[1] = local_b6.Op[1];
  pvVar1->Version = local_b6.Version;
  pvVar1->Op[0] = local_b6.Op[0];
  DWARFExpression::Operation::Description::Description(&local_b9,Dwarf2,SignedSizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x91);
  pvVar1->Op[1] = local_b9.Op[1];
  pvVar1->Version = local_b9.Version;
  pvVar1->Op[0] = local_b9.Op[0];
  DWARFExpression::Operation::Description::Description(&local_bc,Dwarf2,SizeLEB,SignedSizeLEB);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x92);
  pvVar1->Op[1] = local_bc.Op[1];
  pvVar1->Version = local_bc.Version;
  pvVar1->Op[0] = local_bc.Op[0];
  DWARFExpression::Operation::Description::Description(&local_bf,Dwarf2,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x93);
  pvVar1->Op[1] = local_bf.Op[1];
  pvVar1->Version = local_bf.Version;
  pvVar1->Op[0] = local_bf.Op[0];
  DWARFExpression::Operation::Description::Description(&local_c2,Dwarf2,Size1,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x94);
  pvVar1->Op[1] = local_c2.Op[1];
  pvVar1->Version = local_c2.Version;
  pvVar1->Op[0] = local_c2.Op[0];
  DWARFExpression::Operation::Description::Description(&local_c5,Dwarf2,Size1,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x95);
  pvVar1->Op[1] = local_c5.Op[1];
  pvVar1->Version = local_c5.Version;
  pvVar1->Op[0] = local_c5.Op[0];
  DWARFExpression::Operation::Description::Description(&local_c8,Dwarf2,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x96);
  pvVar1->Op[1] = local_c8.Op[1];
  pvVar1->Version = local_c8.Version;
  pvVar1->Op[0] = local_c8.Op[0];
  DWARFExpression::Operation::Description::Description(&local_cb,Dwarf3,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x97);
  pvVar1->Op[1] = local_cb.Op[1];
  pvVar1->Version = local_cb.Version;
  pvVar1->Op[0] = local_cb.Op[0];
  DWARFExpression::Operation::Description::Description(&local_ce,Dwarf3,Size2,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x98);
  pvVar1->Op[1] = local_ce.Op[1];
  pvVar1->Version = local_ce.Version;
  pvVar1->Op[0] = local_ce.Op[0];
  DWARFExpression::Operation::Description::Description(&local_d1,Dwarf3,Size4,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x99);
  pvVar1->Op[1] = local_d1.Op[1];
  pvVar1->Version = local_d1.Version;
  pvVar1->Op[0] = local_d1.Op[0];
  DWARFExpression::Operation::Description::Description(&local_d4,Dwarf3,SizeRefAddr,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9a);
  pvVar1->Op[1] = local_d4.Op[1];
  pvVar1->Version = local_d4.Version;
  pvVar1->Op[0] = local_d4.Op[0];
  DWARFExpression::Operation::Description::Description(&local_d7,Dwarf3,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9b);
  pvVar1->Op[1] = local_d7.Op[1];
  pvVar1->Version = local_d7.Version;
  pvVar1->Op[0] = local_d7.Op[0];
  DWARFExpression::Operation::Description::Description(&local_da,Dwarf3,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9c);
  pvVar1->Op[1] = local_da.Op[1];
  pvVar1->Version = local_da.Version;
  pvVar1->Op[0] = local_da.Op[0];
  DWARFExpression::Operation::Description::Description(&local_dd,Dwarf3,SizeLEB,SizeLEB);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9d);
  pvVar1->Op[1] = local_dd.Op[1];
  pvVar1->Version = local_dd.Version;
  pvVar1->Op[0] = local_dd.Op[0];
  DWARFExpression::Operation::Description::Description(&local_e0,Dwarf3,SizeLEB,SizeBlock);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9e);
  pvVar1->Op[1] = local_e0.Op[1];
  pvVar1->Version = local_e0.Version;
  pvVar1->Op[0] = local_e0.Op[0];
  DWARFExpression::Operation::Description::Description(&local_e3,Dwarf3,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0x9f);
  pvVar1->Op[1] = local_e3.Op[1];
  pvVar1->Version = local_e3.Version;
  pvVar1->Op[0] = local_e3.Op[0];
  DWARFExpression::Operation::Description::Description(&local_e6,Dwarf4,SizeLEB,SignedSizeLEB);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xed);
  pvVar1->Op[1] = local_e6.Op[1];
  pvVar1->Version = local_e6.Version;
  pvVar1->Op[0] = local_e6.Op[0];
  DWARFExpression::Operation::Description::Description(&local_e9,Dwarf3,SizeNA,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xe0);
  pvVar1->Op[1] = local_e9.Op[1];
  pvVar1->Version = local_e9.Version;
  pvVar1->Op[0] = local_e9.Op[0];
  DWARFExpression::Operation::Description::Description(&local_ec,Dwarf4,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xa1);
  pvVar1->Op[1] = local_ec.Op[1];
  pvVar1->Version = local_ec.Version;
  pvVar1->Op[0] = local_ec.Op[0];
  DWARFExpression::Operation::Description::Description(&local_ef,Dwarf4,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xfb);
  pvVar1->Op[1] = local_ef.Op[1];
  pvVar1->Version = local_ef.Version;
  pvVar1->Op[0] = local_ef.Op[0];
  DWARFExpression::Operation::Description::Description(&local_f2,Dwarf4,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xfc);
  pvVar1->Op[1] = local_f2.Op[1];
  pvVar1->Version = local_f2.Version;
  pvVar1->Op[0] = local_f2.Op[0];
  DWARFExpression::Operation::Description::Description(&local_f5,Dwarf4,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xf3);
  pvVar1->Op[1] = local_f5.Op[1];
  pvVar1->Version = local_f5.Version;
  pvVar1->Op[0] = local_f5.Op[0];
  DWARFExpression::Operation::Description::Description(&local_f8,Dwarf5,BaseTypeRef,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xa8);
  pvVar1->Op[1] = local_f8.Op[1];
  pvVar1->Version = local_f8.Version;
  pvVar1->Op[0] = local_f8.Op[0];
  DWARFExpression::Operation::Description::Description(&local_fb,Dwarf5,SizeLEB,SizeNA);
  pvVar1 = std::
           vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
           ::operator[](in_RDI,0xa3);
  pvVar1->Version = local_fb.Version;
  pvVar1->Op[0] = local_fb.Op[0];
  pvVar1->Op[1] = local_fb.Op[1];
  return in_RDI;
}

Assistant:

static DescVector getDescriptions() {
  DescVector Descriptions;
  typedef DWARFExpression::Operation Op;
  typedef Op::Description Desc;

  Descriptions.resize(0xff);
  Descriptions[DW_OP_addr] = Desc(Op::Dwarf2, Op::SizeAddr);
  Descriptions[DW_OP_deref] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_const1u] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_const1s] = Desc(Op::Dwarf2, Op::SignedSize1);
  Descriptions[DW_OP_const2u] = Desc(Op::Dwarf2, Op::Size2);
  Descriptions[DW_OP_const2s] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_const4u] = Desc(Op::Dwarf2, Op::Size4);
  Descriptions[DW_OP_const4s] = Desc(Op::Dwarf2, Op::SignedSize4);
  Descriptions[DW_OP_const8u] = Desc(Op::Dwarf2, Op::Size8);
  Descriptions[DW_OP_const8s] = Desc(Op::Dwarf2, Op::SignedSize8);
  Descriptions[DW_OP_constu] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_consts] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_dup] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_drop] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_over] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_pick] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_swap] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_rot] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_xderef] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_abs] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_and] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_div] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_minus] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_mod] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_mul] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_neg] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_not] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_or] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_plus] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_plus_uconst] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_shl] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_shr] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_shra] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_xor] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_skip] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_bra] = Desc(Op::Dwarf2, Op::SignedSize2);
  Descriptions[DW_OP_eq] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_ge] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_gt] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_le] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_lt] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_ne] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_lit0; LA <= DW_OP_lit31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_reg0; LA <= DW_OP_reg31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2);
  for (uint16_t LA = DW_OP_breg0; LA <= DW_OP_breg31; ++LA)
    Descriptions[LA] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_regx] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_fbreg] = Desc(Op::Dwarf2, Op::SignedSizeLEB);
  Descriptions[DW_OP_bregx] = Desc(Op::Dwarf2, Op::SizeLEB, Op::SignedSizeLEB);
  Descriptions[DW_OP_piece] = Desc(Op::Dwarf2, Op::SizeLEB);
  Descriptions[DW_OP_deref_size] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_xderef_size] = Desc(Op::Dwarf2, Op::Size1);
  Descriptions[DW_OP_nop] = Desc(Op::Dwarf2);
  Descriptions[DW_OP_push_object_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_call2] = Desc(Op::Dwarf3, Op::Size2);
  Descriptions[DW_OP_call4] = Desc(Op::Dwarf3, Op::Size4);
  Descriptions[DW_OP_call_ref] = Desc(Op::Dwarf3, Op::SizeRefAddr);
  Descriptions[DW_OP_form_tls_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_call_frame_cfa] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_bit_piece] = Desc(Op::Dwarf3, Op::SizeLEB, Op::SizeLEB);
  Descriptions[DW_OP_implicit_value] =
      Desc(Op::Dwarf3, Op::SizeLEB, Op::SizeBlock);
  Descriptions[DW_OP_stack_value] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_WASM_location] =
      Desc(Op::Dwarf4, Op::SizeLEB, Op::SignedSizeLEB);
  Descriptions[DW_OP_GNU_push_tls_address] = Desc(Op::Dwarf3);
  Descriptions[DW_OP_addrx] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_addr_index] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_const_index] = Desc(Op::Dwarf4, Op::SizeLEB);
  Descriptions[DW_OP_GNU_entry_value] = Desc(Op::Dwarf4, Op::SizeLEB);

  Descriptions[DW_OP_convert] = Desc(Op::Dwarf5, Op::BaseTypeRef);
  Descriptions[DW_OP_entry_value] = Desc(Op::Dwarf5, Op::SizeLEB);

  return Descriptions;
}